

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

double ** clone_matrix<double>(double **matrix,int row,int col)

{
  double **ppdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  ppdVar1 = new_matrix<double>(row,col);
  uVar2 = 0;
  uVar4 = (ulong)(uint)col;
  if (col < 1) {
    uVar4 = uVar2;
  }
  uVar5 = (ulong)(uint)row;
  if (row < 1) {
    uVar5 = uVar2;
  }
  for (; uVar2 != uVar5; uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      ppdVar1[uVar2][uVar3] = matrix[uVar2][uVar3];
    }
  }
  return ppdVar1;
}

Assistant:

T** clone_matrix(T** matrix, int row, int col)
{
    T** ret_val = new_matrix<T>(row, col);

    for (int i = 0; i < row; ++i) {
        for (int j = 0; j < col; ++j) {
            ret_val[i][j] = matrix[i][j];
        }
    }

    return ret_val;
}